

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  _func_int *p_Var1;
  bool bVar2;
  int *piVar3;
  Allocator *pAVar4;
  undefined8 uVar5;
  void *pvVar6;
  long *plVar7;
  bool bVar8;
  ulong uVar9;
  undefined3 uVar10;
  undefined8 uVar11;
  bool bVar12;
  bool bVar13;
  _func_int **pp_Var14;
  Layer *pLVar15;
  int iVar16;
  uint inch;
  uint uVar17;
  uint kernel_w;
  Option *opt_00;
  int iVar18;
  uint kernel_h;
  _func_int *p_Var19;
  long lVar20;
  byte bVar21;
  byte bVar22;
  ParamDict pd_5;
  ParamDict pd;
  undefined4 uStack_c4;
  int local_c0;
  Allocator *local_b8;
  int iStack_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  int local_a0 [2];
  size_t local_98 [2];
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 local_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_40;
  
  pp_Var14 = this->_vptr_Convolution_x86;
  p_Var19 = pp_Var14[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var19) != 0) {
    return 0;
  }
  switch(*(undefined4 *)((long)&(this->weight_winograd43_data).allocator + (long)(p_Var19 + 4))) {
  case 1:
    pLVar15 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 2:
    pLVar15 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var19));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 3:
    pLVar15 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var19));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var19) + 4));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 4:
    pLVar15 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 5:
    pLVar15 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  case 6:
    pLVar15 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var19));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var19) + 4));
    (*pLVar15->_vptr_Layer[2])(pLVar15,&pd);
    break;
  default:
    pLVar15 = (Layer *)0x0;
    goto LAB_0019b78d;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar15->_vptr_Layer[4])(pLVar15,opt);
  pp_Var14 = this->_vptr_Convolution_x86;
LAB_0019b78d:
  this->activation = pLVar15;
  p_Var19 = pp_Var14[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var19) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar17 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
  kernel_w = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
  opt_00 = (Option *)(ulong)kernel_w;
  kernel_h = *(uint *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
  uVar9 = (long)*(int *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var19) /
          (long)(int)(kernel_h * kernel_w);
  uVar9 = (long)((ulong)(uint)((int)uVar9 >> 0x1f) << 0x20 | uVar9 & 0xffffffff) / (long)(int)uVar17
  ;
  bVar2 = opt->use_packing_layout;
  if ((((kernel_w == kernel_h && bVar2 == false) &&
       (iVar16 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19), iVar16 != 1))
      && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == iVar16)) &&
     ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
      (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) {
    pLVar15 = create_layer(6);
    this->convolution_dilation1 = pLVar15;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).h +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).d +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).c +
                           (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elempack +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,6,*(int *)(&(this->weight_winograd43_data).field_0x1c +
                                   (long)this->_vptr_Convolution_x86[-3]));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var14 = this->_vptr_Convolution_x86;
    if (*(int *)((long)&(this->weight_winograd43_data).elempack + (long)pp_Var14[-3]) == 0) {
      local_98[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_c4 = 0;
      local_c0 = 0;
      local_b8 = (Allocator *)0x0;
      iStack_b0 = 0;
      iStack_ac = 0;
      iStack_a8 = 0;
      iStack_a4 = 0;
      local_a0[0] = 0;
      p_Var19 = pp_Var14[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var19)) {
        piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        uVar5 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        pd.d._0_4_ = (undefined4)uVar5;
        pd.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        uStack_c4 = (undefined4)
                    ((ulong)*(undefined8 *)
                             ((long)&(this->weight_winograd63_data).cstep + (long)p_Var19) >> 0x20);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
        local_b8 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var19);
        uVar5 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var19);
        uVar11 = *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var19);
        iStack_b0 = (int)uVar5;
        iStack_ac = (int)((ulong)uVar5 >> 0x20);
        iStack_a8 = (int)uVar11;
        iStack_a4 = (int)((ulong)uVar11 >> 0x20);
        local_a0[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var19);
        local_98[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var19);
      }
      pLVar15 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      (*pLVar15->_vptr_Layer[3])(pLVar15,&local_40);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      piVar3 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_98[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_c4 = 0;
      local_c0 = 0;
      local_b8 = (Allocator *)0x0;
      iStack_b0 = 0;
      iStack_ac = 0;
      iStack_a8 = 0;
      iStack_a4 = 0;
      local_a0[0] = 0;
      p_Var19 = pp_Var14[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var19)) {
        piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        uVar5 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        pd.d._0_4_ = (undefined4)uVar5;
        pd.d._4_4_ = (undefined4)((ulong)uVar5 >> 0x20);
        uStack_c4 = (undefined4)
                    ((ulong)*(undefined8 *)
                             ((long)&(this->weight_winograd63_data).cstep + (long)p_Var19) >> 0x20);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
        local_b8 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var19);
        iStack_b0 = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var19);
        iStack_ac = *(int *)((long)&(this->scale_in_data).refcount + (long)(p_Var19 + 4));
        iStack_a8 = *(int *)((long)&(this->scale_in_data).elemsize + (long)p_Var19);
        iStack_a4 = *(int *)((long)&(this->scale_in_data).elemsize + (long)(p_Var19 + 4));
        local_a0[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var19);
        local_98[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var19);
        p_Var19 = this->_vptr_Convolution_x86[-3];
      }
      local_50 = 0;
      local_58 = 0;
      uStack_5c = 0;
      uStack_60 = 0;
      uStack_64 = 0;
      uStack_68 = 0;
      local_70 = 0;
      local_78 = 0;
      uStack_7c = 0;
      local_80 = 0;
      uStack_84 = 0;
      uStack_88 = 0;
      local_98[1] = 0;
      if ((_func_int *)(local_98 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).dims + (long)p_Var19)) {
        piVar3 = *(int **)((long)&(this->scale_in_data).h + (long)p_Var19);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        local_98[1] = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var19);
        uVar5 = *(undefined8 *)((long)&(this->scale_in_data).h + (long)p_Var19);
        uStack_88 = (undefined4)uVar5;
        uStack_84 = (undefined4)((ulong)uVar5 >> 0x20);
        uVar5 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var19);
        local_80 = (undefined4)uVar5;
        uStack_7c = (undefined4)((ulong)uVar5 >> 0x20);
        local_78 = *(undefined4 *)((long)&(this->scale_in_data).cstep + (long)p_Var19);
        local_70 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var19);
        uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var19);
        uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var19) >> 0x20)
        ;
        uStack_60 = (undefined4)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var19);
        uStack_5c = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var19) >> 0x20)
        ;
        local_58 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var19);
        local_50 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var19);
      }
      pLVar15 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      (*pLVar15->_vptr_Layer[3])(pLVar15,&local_40);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      lVar20 = 0x48;
      do {
        piVar3 = *(int **)((long)&pd.d + lVar20);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar6 = *(void **)((long)&pd._vptr_ParamDict + lVar20);
            if (*(long **)((long)&local_b8 + lVar20) == (long *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_b8 + lVar20) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_98 + lVar20) = 0;
        *(undefined8 *)((long)&pd.d + lVar20 + 4) = 0;
        *(undefined8 *)((long)&uStack_c4 + lVar20) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar20) = 0;
        *(undefined8 *)((long)&pd.d + lVar20) = 0;
        *(undefined8 *)((long)&iStack_b0 + lVar20) = 0;
        *(undefined8 *)((long)&iStack_a8 + lVar20) = 0;
        *(undefined4 *)((long)local_a0 + lVar20) = 0;
        lVar20 = lVar20 + -0x48;
      } while (lVar20 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var19 = this->_vptr_Convolution_x86[-3];
      piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pvVar6 = *(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
          plVar7 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var19);
          if (plVar7 == (long *)0x0) {
            if (pvVar6 != (void *)0x0) {
              free(pvVar6);
            }
          }
          else {
            (**(code **)(*plVar7 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var19) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var19) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var19 + 4)) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var19) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var19) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var19) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var19) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var19) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  inch = (uint)uVar9;
  if (bVar2 == false) {
    bVar12 = false;
LAB_0019babc:
    bVar22 = bVar2 ^ 1;
    bVar21 = bVar2;
  }
  else {
    bVar21 = (uVar9 & 3) == 0;
    bVar12 = (bool)bVar21;
    if (((inch | uVar17) & 3) == 0) {
      if (((kernel_h == 1 && kernel_w == 1) &&
          (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1)) &&
         (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) ||
          ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))))) {
        kernel_w = 1;
        kernel_h = 1;
LAB_0019c163:
        convolution_im2col_sgemm_transform_kernel_pack4_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_sgemm_data,inch,uVar17,kernel_w,kernel_h);
      }
      else {
        if (opt->use_winograd_convolution == true) {
          bVar13 = opt->use_winograd23_convolution;
          if ((bVar13 == false) && (opt->use_winograd43_convolution == false)) {
            if (((kernel_h == 3) && (kernel_w == 3)) && (opt->use_winograd63_convolution != false))
            {
LAB_0019c059:
              if (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1) &&
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
                 ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1
                  && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1))))
              {
                if (((opt->use_winograd63_convolution == true) && (7 < (int)inch)) &&
                   ((uVar17 - 8 < 0x19 && (inch < 0x21)))) {
LAB_0019c59f:
                  conv3x3s1_winograd63_transform_kernel_pack4_sse
                            ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                             &this->weight_winograd63_data,inch,uVar17,opt_00);
                }
                else {
                  if (opt->use_winograd43_convolution == false) {
                    if (bVar13 == false) goto LAB_0019c59f;
                  }
                  else {
                    bVar8 = 7 < (int)uVar17;
                    uVar10 = (undefined3)(kernel_w >> 8);
                    opt_00 = (Option *)(ulong)CONCAT31(uVar10,bVar8);
                    if (((bVar13 | opt->use_winograd63_convolution) != 1) ||
                       (opt_00 = (Option *)(ulong)CONCAT31(uVar10,bVar8 && 7 < (int)inch),
                       bVar8 && 7 < (int)inch)) {
                      conv3x3s1_winograd43_transform_kernel_pack4_sse
                                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                                 &this->weight_winograd43_data,inch,uVar17,opt_00);
                      goto LAB_0019babc;
                    }
                  }
                  conv3x3s1_winograd23_transform_kernel_pack4_sse
                            ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                             &this->weight_winograd23_data,inch,uVar17,opt_00);
                }
                goto LAB_0019babc;
              }
            }
          }
          else if (kernel_h == 3 && kernel_w == 3) goto LAB_0019c059;
        }
        iVar16 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19);
        if (iVar16 == 1) {
          iVar16 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
          if (iVar16 == 1) {
            if ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)) {
              bVar13 = false;
              if ((0xb < (int)uVar17) || (bVar13 = false, 0xb < (int)inch)) goto LAB_0019c14b;
            }
            if (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)))
                || (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19))) &&
               ((bVar13 = false, 0xf < (int)uVar17 || (0xf < (int)inch)))) goto LAB_0019c14b;
          }
          else {
LAB_0019c138:
            if (1 < iVar16) goto LAB_0019c13d;
          }
        }
        else {
          if (iVar16 < 2) {
            iVar16 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
            goto LAB_0019c138;
          }
LAB_0019c13d:
          bVar13 = (int)uVar17 < 0x10 && (int)inch < 0x10;
LAB_0019c14b:
          if ((opt->use_sgemm_convolution == true) && (!bVar13)) goto LAB_0019c163;
        }
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_data_tm,inch,uVar17,kernel_w,kernel_h,4,4);
      }
      goto LAB_0019babc;
    }
    bVar22 = (uVar17 & 3) != 0;
    if ((!(bool)bVar22) && ((uVar9 & 3) != 0)) {
      if (kernel_w == 3) {
        if ((kernel_h != 3) ||
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 1 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 1)))) &&
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 2)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 2))))))
        goto LAB_0019bf82;
        kernel_w = 3;
        kernel_h = 3;
LAB_0019c028:
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_data_tm,inch,uVar17,kernel_w,kernel_h,1,4);
      }
      else {
        if (((kernel_w == 1) && (kernel_h == 1)) &&
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
              ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1))))
             && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))) {
          kernel_w = 1;
          kernel_h = 1;
        }
        else {
LAB_0019bf82:
          iVar16 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19);
          if (iVar16 == 1) {
            iVar16 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
            if (iVar16 != 1) {
LAB_0019bfe6:
              if (iVar16 < 2) goto LAB_0019c028;
              goto LAB_0019bfeb;
            }
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 1)
                 || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 1)) ||
                ((int)uVar17 < 0xc && (int)inch < 0xc)) &&
               (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) < 2 &&
                 (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) < 2)) ||
                ((int)uVar17 < 0x10 && (int)inch < 0x10)))) goto LAB_0019c028;
            bVar2 = false;
          }
          else {
            if (iVar16 < 2) {
              iVar16 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
              goto LAB_0019bfe6;
            }
LAB_0019bfeb:
            bVar2 = (int)uVar17 < 0x10 && (int)inch < 0x10;
          }
          if ((bVar2) || (opt->use_sgemm_convolution == false)) goto LAB_0019c028;
        }
        convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_sgemm_data,inch,uVar17,kernel_w,kernel_h);
      }
      goto LAB_0019c27c;
    }
  }
  if ((bVar22 != 0) && (bVar12)) {
    p_Var19 = this->_vptr_Convolution_x86[-3];
    uVar17 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
    if (((uVar17 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 1))
       && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
            (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) ||
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
            ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2 &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))))) {
      iVar16 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
      uVar17 = 1;
      iVar18 = 1;
LAB_0019bd29:
      convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_sgemm_data,inch,iVar16,uVar17,iVar18);
    }
    else if ((((opt->use_winograd_convolution == true) && (uVar17 == 3)) &&
             (opt->use_winograd63_convolution != false)) &&
            ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 3 &&
               (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))))) {
      conv3x3s1_winograd63_transform_kernel_pack4to1_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_winograd63_data,inch,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),
                 (Option *)(ulong)uVar17);
    }
    else {
      iVar16 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19);
      if (iVar16 == 1) {
        iVar16 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
        if (iVar16 == 1) {
          if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)) &&
              ((0xb < (int)inch ||
               (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19))))) ||
             (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) ||
               (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19))) &&
              ((0xf < (int)inch ||
               (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19)))))))
          goto LAB_0019bc44;
        }
        else {
LAB_0019bc32:
          if (1 < iVar16) goto LAB_0019bc3b;
        }
      }
      else {
        if (iVar16 < 2) {
          iVar16 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
          goto LAB_0019bc32;
        }
LAB_0019bc3b:
        if ((int)inch < 0x10) {
          bVar2 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19) < 0x10;
        }
        else {
LAB_0019bc44:
          bVar2 = false;
        }
        if ((opt->use_sgemm_convolution == true) && (!bVar2)) {
          iVar16 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
          iVar18 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
          goto LAB_0019bd29;
        }
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_data_tm,inch,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),uVar17,
                 *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19),4,1);
    }
  }
  if ((bVar22 & (bVar21 ^ 1)) != 1) goto LAB_0019c27c;
  p_Var19 = this->_vptr_Convolution_x86[-3];
  uVar17 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
  if (((uVar17 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 1)) &&
     (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
       (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)) &&
        (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) ||
      ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2)) &&
       (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))) {
    iVar16 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
    uVar17 = 1;
    iVar18 = 1;
  }
  else {
    if (opt->use_winograd_convolution == true) {
      bVar21 = opt->use_winograd23_convolution;
      if ((bool)bVar21 == false) {
        if ((uVar17 == 3) && (opt->use_winograd43_convolution != false)) goto LAB_0019be1d;
      }
      else if (uVar17 == 3) {
LAB_0019be1d:
        if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 3) &&
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1)) &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) {
          iVar16 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
          if ((opt->use_winograd43_convolution == true) && (0xf < (int)inch)) {
            bVar21 = iVar16 < 0x10 & bVar21;
          }
          if (bVar21 == 0) {
            conv3x3s1_winograd43_transform_kernel_sse
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                       &this->weight_winograd43_data,inch,iVar16,(Option *)(ulong)uVar17);
          }
          else {
            conv3x3s1_winograd23_transform_kernel_sse
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                       &this->weight_winograd23_data,inch,iVar16,(Option *)(ulong)uVar17);
          }
          goto LAB_0019c27c;
        }
      }
    }
    if (opt->use_sgemm_convolution != true) {
      if (p_Var19 != (_func_int *)0xfffffffffffffeb0) {
        piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        piVar3 = (this->weight_data_tm).refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar6 = (this->weight_data_tm).data;
            pAVar4 = (this->weight_data_tm).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar6 != (void *)0x0) {
                free(pvVar6);
              }
            }
            else {
              (*pAVar4->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        p_Var1 = (_func_int *)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        piVar3 = *(int **)(p_Var1 + 8);
        (this->weight_data_tm).data = *(void **)p_Var1;
        (this->weight_data_tm).refcount = piVar3;
        (this->weight_data_tm).elemsize =
             *(size_t *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var19);
        (this->weight_data_tm).elempack =
             *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
        (this->weight_data_tm).allocator =
             *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var19);
        p_Var1 = (_func_int *)((long)&(this->scale_in_data).refcount + (long)p_Var19);
        uVar5 = *(undefined8 *)p_Var1;
        uVar11 = *(undefined8 *)(p_Var1 + 8);
        (this->weight_data_tm).dims = (int)uVar5;
        (this->weight_data_tm).w = (int)((ulong)uVar5 >> 0x20);
        (this->weight_data_tm).h = (int)uVar11;
        (this->weight_data_tm).d = (int)((ulong)uVar11 >> 0x20);
        (this->weight_data_tm).c = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var19);
        (this->weight_data_tm).cstep =
             *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var19);
      }
      goto LAB_0019c27c;
    }
    iVar16 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
    iVar18 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
  }
  convolution_im2col_sgemm_transform_kernel_sse
            ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
             &this->weight_sgemm_data,inch,iVar16,uVar17,iVar18);
LAB_0019c27c:
  if (opt->lightmode == true) {
    p_Var19 = this->_vptr_Convolution_x86[-3];
    piVar3 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pvVar6 = *(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        plVar7 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var19);
        if (plVar7 == (long *)0x0) {
          if (pvVar6 != (void *)0x0) {
            free(pvVar6);
          }
        }
        else {
          (**(code **)(*plVar7 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var19) = 0;
    *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var19) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var19 + 4)) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var19) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var19) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var19) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var19) = 0;
    *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var19) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}